

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGeneratorMocUic::JobParseT::ParseUicInclude
          (JobParseT *this,WorkerT *wrk,MetaT *meta,string *includeString)

{
  bool bVar1;
  bool bVar2;
  pointer *__ptr;
  string uiInputFile;
  _Head_base<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_false> local_58;
  undefined1 local_50 [8];
  undefined1 local_48 [32];
  
  UicFindIncludedFile((string *)local_48,this,wrk,meta,includeString);
  if (local_48._8_8_ == 0) {
    bVar2 = false;
  }
  else {
    bVar1 = UicSettingsT::skipped(&wrk->Gen_->Uic_,(string *)local_48);
    bVar2 = true;
    if (!bVar1) {
      std::
      make_unique<cmQtAutoGeneratorMocUic::JobUicT,std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &this->FileName);
      local_58._M_head_impl = (JobT *)local_50;
      bVar2 = ParallelJobPushUic(wrk->Gen_,(JobHandleT *)&local_58);
      if (local_58._M_head_impl != (JobT *)0x0) {
        (*(local_58._M_head_impl)->_vptr_JobT[1])();
      }
    }
  }
  std::__cxx11::string::~string((string *)local_48);
  return bVar2;
}

Assistant:

bool cmQtAutoGeneratorMocUic::JobParseT::ParseUicInclude(
  WorkerT& wrk, MetaT const& meta, std::string&& includeString)
{
  bool success = false;
  std::string uiInputFile = UicFindIncludedFile(wrk, meta, includeString);
  if (!uiInputFile.empty()) {
    if (!wrk.Uic().skipped(uiInputFile)) {
      JobHandleT jobHandle = cm::make_unique<JobUicT>(
        std::move(uiInputFile), FileName, std::move(includeString));
      success = wrk.Gen().ParallelJobPushUic(jobHandle);
    } else {
      // A skipped file is successful
      success = true;
    }
  }
  return success;
}